

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpatch.hpp
# Opt level: O0

basic_json_pointer<char> *
jsoncons::jsonpatch::detail::
definite_path<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *root,
          basic_json_pointer<char> *location)

{
  bool bVar1;
  byte bVar2;
  reference this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens_00;
  error_code *in_RDI;
  string_type last_token;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> val;
  error_code ec;
  basic_json_pointer<char> pointer;
  iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  reverse_iterator rit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  error_code *this_00;
  value_type *in_stack_fffffffffffffee8;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  basic_json_pointer<char> *in_stack_ffffffffffffff10;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff18;
  error_code local_b8 [3];
  reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68 [4];
  string local_48 [72];
  
  jsonpointer::basic_json_pointer<char>::rbegin_abi_cxx11_
            ((basic_json_pointer<char> *)in_stack_fffffffffffffed8);
  jsonpointer::basic_json_pointer<char>::rend_abi_cxx11_
            ((basic_json_pointer<char> *)in_stack_fffffffffffffed8);
  bVar1 = std::operator==(in_stack_fffffffffffffef0,
                          (reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)in_stack_fffffffffffffee8);
  if (bVar1) {
    jsonpointer::basic_json_pointer<char>::basic_json_pointer
              ((basic_json_pointer<char> *)in_stack_fffffffffffffee0,
               (basic_json_pointer<char> *)in_stack_fffffffffffffed8);
    return (basic_json_pointer<char> *)in_RDI;
  }
  this = std::
         reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)in_stack_fffffffffffffee0);
  jsonpatch_names<char>::dash_name_abi_cxx11_();
  bVar2 = std::operator!=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::__cxx11::string::~string(local_48);
  if ((bVar2 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x554b98);
    local_68[0]._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         jsonpointer::basic_json_pointer<char>::begin_abi_cxx11_(in_stack_fffffffffffffed8);
    while( true ) {
      jsonpointer::basic_json_pointer<char>::rbegin_abi_cxx11_
                ((basic_json_pointer<char> *)in_stack_fffffffffffffed8);
      local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::base(&local_80);
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator-((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)in_stack_fffffffffffffee8,(difference_type)in_stack_fffffffffffffee0
                            );
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffee0,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffed8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,in_stack_fffffffffffffee8);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(local_68);
    }
    jsonpointer::basic_json_pointer<char>::basic_json_pointer
              ((basic_json_pointer<char> *)in_stack_fffffffffffffee0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffed8);
    this_00 = local_b8;
    std::error_code::error_code(this_00);
    __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             jsonpointer::
             get<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                       (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_RDI);
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this_00
               ,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                in_stack_fffffffffffffed8);
    bVar1 = std::error_code::operator_cast_to_bool(local_b8);
    if ((bVar1) ||
       (bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                          ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)CONCAT17(bVar2,in_stack_fffffffffffffef8)), !bVar1)) {
      jsonpointer::basic_json_pointer<char>::basic_json_pointer
                ((basic_json_pointer<char> *)this_00,
                 (basic_json_pointer<char> *)in_stack_fffffffffffffed8);
    }
    else {
      std::__cxx11::string::string((string *)&stack0xffffffffffffff10);
      tokens_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                     size((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                           *)__args);
      jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>
                (last_token.field_2._8_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 last_token.field_2._M_allocated_capacity);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this,__args);
      jsonpointer::basic_json_pointer<char>::basic_json_pointer
                ((basic_json_pointer<char> *)this_00,tokens_00);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
    }
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               0x554daf);
    jsonpointer::basic_json_pointer<char>::~basic_json_pointer((basic_json_pointer<char> *)0x554dbc)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
    return (basic_json_pointer<char> *)in_RDI;
  }
  jsonpointer::basic_json_pointer<char>::basic_json_pointer
            ((basic_json_pointer<char> *)in_stack_fffffffffffffee0,
             (basic_json_pointer<char> *)in_stack_fffffffffffffed8);
  return (basic_json_pointer<char> *)in_RDI;
}

Assistant:

jsonpointer::basic_json_pointer<typename Json::char_type> definite_path(const Json& root, jsonpointer::basic_json_pointer<typename Json::char_type>& location)
    {
        using char_type = typename Json::char_type;
        using string_type = std::basic_string<char_type>;

        auto rit = location.rbegin();
        if (rit == location.rend())
        {
            return location;
        }

        if (*rit != jsonpatch_names<char_type>::dash_name())
        {
            return location;
        }

        std::vector<string_type> tokens;
        for (auto it = location.begin(); it != location.rbegin().base()-1; ++it)
        {
            tokens.push_back(*it);
        }
        jsonpointer::basic_json_pointer<char_type> pointer(tokens);

        std::error_code ec;

        Json val = jsonpointer::get(root, pointer, ec);
        if (ec || !val.is_array())
        {
            return location;
        }
        string_type last_token;
        jsoncons::detail::from_integer(val.size(), last_token);
        tokens.emplace_back(std::move(last_token));

        return jsonpointer::basic_json_pointer<char_type>(std::move(tokens));
    }